

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audit.cpp
# Opt level: O0

ssize_t __thiscall
Vault::Sys::Audit::read_abi_cxx11_(Audit *this,int __fd,void *__buf,size_t __nbytes)

{
  Client *client;
  undefined4 in_register_00000034;
  Audit *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  Url local_38;
  Audit *local_18;
  Audit *this_local;
  
  this_00 = (Audit *)CONCAT44(in_register_00000034,__fd);
  client = *(Client **)this_00;
  local_58.field_2._M_allocated_capacity = 0;
  local_58.field_2._8_8_ = 0;
  local_58._M_dataplus = (_Alloc_hider)0x0;
  local_58._1_7_ = 0;
  local_58._M_string_length = 0;
  local_18 = this_00;
  this_local = this;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny((Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_58);
  getUrl(&local_38,this_00,(Path *)&local_58);
  HttpConsumer::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this,client,&local_38);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_38);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny((Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_58);
  return (ssize_t)this;
}

Assistant:

std::optional<std::string> Vault::Sys::Audit::read() {
  return HttpConsumer::get(client_, getUrl(Path{}));
}